

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmBinaryOp(ExpressionContext *ctx,VmModule *module,ExprBinaryOp *node)

{
  int iVar1;
  VmValueType VVar2;
  uint uVar3;
  SynBase *source;
  VmValue *pVVar4;
  VmBlock *pVVar5;
  VmBlock *block;
  VmBlock *block_00;
  VmConstant *pVVar6;
  VmInstruction *pVVar7;
  VmInstruction *valueB;
  VmValue *lhs;
  TypeBase *pTVar8;
  SynBase *pSVar9;
  VmModule *module_00;
  VmType type;
  TypeBase *pTStackY_60;
  VmValue *in_stack_ffffffffffffffb0;
  VmBlock *local_40;
  
  pVVar4 = CompileVm(ctx,module,node->lhs);
  iVar1 = *(int *)&(node->super_ExprBase).field_0x2c;
  if (iVar1 == 0x13) {
    pVVar5 = anon_unknown.dwarf_11cad6::CreateBlock
                       (module,(node->super_ExprBase).source,"lor_check_rhs");
    block = anon_unknown.dwarf_11cad6::CreateBlock
                      (module,(node->super_ExprBase).source,"lor_store_1");
    block_00 = anon_unknown.dwarf_11cad6::CreateBlock
                         (module,(node->super_ExprBase).source,"lor_store_0");
    local_40 = anon_unknown.dwarf_11cad6::CreateBlock
                         (module,(node->super_ExprBase).source,"lor_exit");
    anon_unknown.dwarf_11cad6::CreateJumpNotZero
              (module,(node->super_ExprBase).source,pVVar4,&block->super_VmValue,
               &pVVar5->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,pVVar5);
    module->currentBlock = pVVar5;
    pVVar4 = CompileVm(ctx,module,node->rhs);
    anon_unknown.dwarf_11cad6::CreateJumpNotZero
              (module,(node->super_ExprBase).source,pVVar4,&block->super_VmValue,
               &block_00->super_VmValue);
LAB_00199b8a:
    VmFunction::AddBlock(module->currentFunction,block);
    module->currentBlock = block;
    pSVar9 = (node->super_ExprBase).source;
    pVVar6 = CreateConstantInt(module->allocator,pSVar9,1);
    pVVar7 = (VmInstruction *)anon_unknown.dwarf_11cad6::CreateLoadImmediate(module,pSVar9,pVVar6);
    anon_unknown.dwarf_11cad6::CreateJump
              (module,(node->super_ExprBase).source,&local_40->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,block_00);
    module->currentBlock = block_00;
    pSVar9 = (node->super_ExprBase).source;
    pVVar6 = CreateConstantInt(module->allocator,pSVar9,0);
    valueB = (VmInstruction *)anon_unknown.dwarf_11cad6::CreateLoadImmediate(module,pSVar9,pVVar6);
    anon_unknown.dwarf_11cad6::CreateJump
              (module,(node->super_ExprBase).source,&local_40->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,local_40);
    module->currentBlock = local_40;
    if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
      pVVar7 = (VmInstruction *)0x0;
    }
    if ((valueB == (VmInstruction *)0x0) || ((valueB->super_VmValue).typeID != 2)) {
      valueB = (VmInstruction *)0x0;
    }
    pVVar7 = (VmInstruction *)
             anon_unknown.dwarf_11cad6::CreatePhi
                       (module,(node->super_ExprBase).source,pVVar7,valueB);
    goto LAB_0019a221;
  }
  if (iVar1 == 0x12) {
    pVVar5 = anon_unknown.dwarf_11cad6::CreateBlock
                       (module,(node->super_ExprBase).source,"land_check_rhs");
    block = anon_unknown.dwarf_11cad6::CreateBlock
                      (module,(node->super_ExprBase).source,"land_store_1");
    block_00 = anon_unknown.dwarf_11cad6::CreateBlock
                         (module,(node->super_ExprBase).source,"land_store_0");
    local_40 = anon_unknown.dwarf_11cad6::CreateBlock
                         (module,(node->super_ExprBase).source,"land_exit");
    anon_unknown.dwarf_11cad6::CreateJumpZero
              (module,(node->super_ExprBase).source,pVVar4,&block_00->super_VmValue,
               &pVVar5->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,pVVar5);
    module->currentBlock = pVVar5;
    pVVar4 = CompileVm(ctx,module,node->rhs);
    anon_unknown.dwarf_11cad6::CreateJumpZero
              (module,(node->super_ExprBase).source,pVVar4,&block_00->super_VmValue,
               &block->super_VmValue);
    goto LAB_00199b8a;
  }
  lhs = CompileVm(ctx,module,node->rhs);
  switch(*(undefined4 *)&(node->super_ExprBase).field_0x2c) {
  case 1:
    pVVar7 = (VmInstruction *)
             anon_unknown.dwarf_11cad6::CreateAdd(module,(node->super_ExprBase).source,pVVar4,lhs);
    goto LAB_0019a210;
  case 2:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) &&
       (((VVar2 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x234,
                    "VmValue *(anonymous namespace)::CreateSub(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x235,
                    "VmValue *(anonymous namespace)::CreateSub(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pSVar9 = *(SynBase **)&pVVar4->type;
    pTVar8 = (pVVar4->type).structType;
    pTStackY_60 = (TypeBase *)0x23;
    break;
  case 3:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) &&
       (((VVar2 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x23c,
                    "VmValue *(anonymous namespace)::CreateMul(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x23d,
                    "VmValue *(anonymous namespace)::CreateMul(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pSVar9 = *(SynBase **)&pVVar4->type;
    pTVar8 = (pVVar4->type).structType;
    pTStackY_60 = (TypeBase *)0x24;
    break;
  case 4:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) &&
       (((VVar2 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x244,
                    "VmValue *(anonymous namespace)::CreateDiv(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x245,
                    "VmValue *(anonymous namespace)::CreateDiv(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pSVar9 = *(SynBase **)&pVVar4->type;
    pTVar8 = (pVVar4->type).structType;
    pTStackY_60 = (TypeBase *)0x25;
    break;
  case 5:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) &&
       (((VVar2 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x254,
                    "VmValue *(anonymous namespace)::CreateMod(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x255,
                    "VmValue *(anonymous namespace)::CreateMod(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pSVar9 = *(SynBase **)&pVVar4->type;
    pTVar8 = (pVVar4->type).structType;
    pTStackY_60 = (TypeBase *)0x27;
    break;
  case 6:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) &&
       (((VVar2 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x24c,
                    "VmValue *(anonymous namespace)::CreatePow(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x24d,
                    "VmValue *(anonymous namespace)::CreatePow(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pSVar9 = *(SynBase **)&pVVar4->type;
    pTVar8 = (pVVar4->type).structType;
    pTStackY_60 = (TypeBase *)0x26;
    break;
  case 7:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) && ((VVar2 != VM_TYPE_LONG || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Long",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x28c,
                    "VmValue *(anonymous namespace)::CreateShl(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x28d,
                    "VmValue *(anonymous namespace)::CreateShl(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pSVar9 = *(SynBase **)&pVVar4->type;
    pTVar8 = (pVVar4->type).structType;
    pTStackY_60 = (TypeBase *)0x2e;
    break;
  case 8:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) && ((VVar2 != VM_TYPE_LONG || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Long",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x294,
                    "VmValue *(anonymous namespace)::CreateShr(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x295,
                    "VmValue *(anonymous namespace)::CreateShr(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pSVar9 = *(SynBase **)&pVVar4->type;
    pTVar8 = (pVVar4->type).structType;
    pTStackY_60 = (TypeBase *)0x2f;
    break;
  case 9:
    pVVar7 = (VmInstruction *)
             anon_unknown.dwarf_11cad6::CreateCompareLess
                       (module,(node->super_ExprBase).source,pVVar4,lhs);
    goto LAB_0019a210;
  case 10:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) &&
       (((VVar2 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x26c,
                    "VmValue *(anonymous namespace)::CreateCompareLessEqual(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x26d,
                    "VmValue *(anonymous namespace)::CreateCompareLessEqual(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pTStackY_60 = (TypeBase *)0x2a;
    goto LAB_00199e15;
  case 0xb:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) &&
       (((VVar2 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x264,
                    "VmValue *(anonymous namespace)::CreateCompareGreater(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x265,
                    "VmValue *(anonymous namespace)::CreateCompareGreater(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pTStackY_60 = (TypeBase *)0x29;
    goto LAB_00199e15;
  case 0xc:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) &&
       (((VVar2 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x274,
                    "VmValue *(anonymous namespace)::CreateCompareGreaterEqual(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x275,
                    "VmValue *(anonymous namespace)::CreateCompareGreaterEqual(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pTStackY_60 = (TypeBase *)0x2b;
    goto LAB_00199e15;
  case 0xd:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if (uVar3 != 4 || VVar2 != VM_TYPE_INT) {
      if ((VVar2 != VM_TYPE_POINTER) && ((VVar2 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || uVar3 != 8)) {
        __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long || lhs->type.type == VM_TYPE_POINTER"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x27c,
                      "VmValue *(anonymous namespace)::CreateCompareEqual(VmModule *, SynBase *, VmValue *, VmValue *)"
                     );
      }
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x27d,
                    "VmValue *(anonymous namespace)::CreateCompareEqual(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pTStackY_60 = (TypeBase *)0x2c;
LAB_00199e15:
    pSVar9 = (SynBase *)0x400000001;
    pTVar8 = (TypeBase *)0x0;
    break;
  case 0xe:
    pSVar9 = (node->super_ExprBase).source;
    goto LAB_00199ebe;
  case 0xf:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) && ((VVar2 != VM_TYPE_LONG || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Long",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x29c,
                    "VmValue *(anonymous namespace)::CreateAnd(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x29d,
                    "VmValue *(anonymous namespace)::CreateAnd(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pSVar9 = *(SynBase **)&pVVar4->type;
    pTVar8 = (pVVar4->type).structType;
    pTStackY_60 = (TypeBase *)0x30;
    break;
  case 0x10:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) && ((VVar2 != VM_TYPE_LONG || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Long",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x2a4,
                    "VmValue *(anonymous namespace)::CreateOr(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x2a5,
                    "VmValue *(anonymous namespace)::CreateOr(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pSVar9 = *(SynBase **)&pVVar4->type;
    pTVar8 = (pVVar4->type).structType;
    pTStackY_60 = (TypeBase *)0x31;
    break;
  case 0x11:
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = (pVVar4->type).type;
    uVar3 = (pVVar4->type).size;
    if ((uVar3 != 4 || VVar2 != VM_TYPE_INT) && ((VVar2 != VM_TYPE_LONG || (uVar3 != 8)))) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Long",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x2ac,
                    "VmValue *(anonymous namespace)::CreateXor(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    if ((VVar2 != (lhs->type).type) || (uVar3 != (lhs->type).size)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x2ad,
                    "VmValue *(anonymous namespace)::CreateXor(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
    pSVar9 = *(SynBase **)&pVVar4->type;
    pTVar8 = (pVVar4->type).structType;
    pTStackY_60 = (TypeBase *)0x32;
    break;
  default:
    goto switchD_00199c9c_caseD_12;
  case 0x14:
    pSVar9 = (node->super_ExprBase).source;
    pVVar6 = CreateConstantZero(module->allocator,pSVar9,pVVar4->type);
    pVVar4 = anon_unknown.dwarf_11cad6::CreateCompareNotEqual
                       (module,pSVar9,pVVar4,&pVVar6->super_VmValue);
    source = (node->super_ExprBase).source;
    pVVar6 = CreateConstantZero(module->allocator,source,lhs->type);
    lhs = anon_unknown.dwarf_11cad6::CreateCompareNotEqual(module,source,lhs,&pVVar6->super_VmValue)
    ;
LAB_00199ebe:
    pVVar7 = (VmInstruction *)
             anon_unknown.dwarf_11cad6::CreateCompareNotEqual(module,pSVar9,pVVar4,lhs);
    goto LAB_0019a210;
  }
  type.structType = pTStackY_60;
  type._0_8_ = pTVar8;
  pVVar7 = anon_unknown.dwarf_11cad6::CreateInstruction
                     ((anon_unknown_dwarf_11cad6 *)module,module_00,pSVar9,type,
                      (VmInstructionType)pVVar4,lhs,in_stack_ffffffffffffffb0);
LAB_0019a210:
  if (pVVar7 == (VmInstruction *)0x0) {
switchD_00199c9c_caseD_12:
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xbcc,
                  "VmValue *CompileVmBinaryOp(ExpressionContext &, VmModule *, ExprBinaryOp *)");
  }
LAB_0019a221:
  anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,&pVVar7->super_VmValue);
  return &pVVar7->super_VmValue;
}

Assistant:

VmValue* CompileVmBinaryOp(ExpressionContext &ctx, VmModule *module, ExprBinaryOp *node)
{
	VmValue *lhs = CompileVm(ctx, module, node->lhs);

	if(node->op == SYN_BINARY_OP_LOGICAL_AND)
	{
		VmBlock *checkRhsBlock = CreateBlock(module, node->source, "land_check_rhs");
		VmBlock *storeOneBlock = CreateBlock(module, node->source, "land_store_1");
		VmBlock *storeZeroBlock = CreateBlock(module, node->source, "land_store_0");
		VmBlock *exitBlock = CreateBlock(module, node->source, "land_exit");

		CreateJumpZero(module, node->source, lhs, storeZeroBlock, checkRhsBlock);

		module->currentFunction->AddBlock(checkRhsBlock);
		module->currentBlock = checkRhsBlock;

		VmValue *rhs = CompileVm(ctx, module, node->rhs);

		CreateJumpZero(module, node->source, rhs, storeZeroBlock, storeOneBlock);

		module->currentFunction->AddBlock(storeOneBlock);
		module->currentBlock = storeOneBlock;

		VmValue *trueValue = CreateLoadImmediate(module, node->source, CreateConstantInt(module->allocator, node->source, 1));

		CreateJump(module, node->source, exitBlock);

		module->currentFunction->AddBlock(storeZeroBlock);
		module->currentBlock = storeZeroBlock;

		VmValue *falseValue = CreateLoadImmediate(module, node->source, CreateConstantInt(module->allocator, node->source, 0));

		CreateJump(module, node->source, exitBlock);

		module->currentFunction->AddBlock(exitBlock);
		module->currentBlock = exitBlock;

		VmValue *phi = CreatePhi(module, node->source, getType<VmInstruction>(trueValue), getType<VmInstruction>(falseValue));

		return CheckType(ctx, node, phi);
	}

	if(node->op == SYN_BINARY_OP_LOGICAL_OR)
	{
		VmBlock *checkRhsBlock = CreateBlock(module, node->source, "lor_check_rhs");
		VmBlock *storeOneBlock = CreateBlock(module, node->source, "lor_store_1");
		VmBlock *storeZeroBlock = CreateBlock(module, node->source, "lor_store_0");
		VmBlock *exitBlock = CreateBlock(module, node->source, "lor_exit");

		CreateJumpNotZero(module, node->source, lhs, storeOneBlock, checkRhsBlock);

		module->currentFunction->AddBlock(checkRhsBlock);
		module->currentBlock = checkRhsBlock;

		VmValue *rhs = CompileVm(ctx, module, node->rhs);

		CreateJumpNotZero(module, node->source, rhs, storeOneBlock, storeZeroBlock);

		module->currentFunction->AddBlock(storeOneBlock);
		module->currentBlock = storeOneBlock;

		VmValue *trueValue = CreateLoadImmediate(module, node->source, CreateConstantInt(module->allocator, node->source, 1));

		CreateJump(module, node->source, exitBlock);

		module->currentFunction->AddBlock(storeZeroBlock);
		module->currentBlock = storeZeroBlock;

		VmValue *falseValue = CreateLoadImmediate(module, node->source, CreateConstantInt(module->allocator, node->source, 0));

		CreateJump(module, node->source, exitBlock);

		module->currentFunction->AddBlock(exitBlock);
		module->currentBlock = exitBlock;

		VmValue *phi = CreatePhi(module, node->source, getType<VmInstruction>(trueValue), getType<VmInstruction>(falseValue));

		return CheckType(ctx, node, phi);
	}

	VmValue *rhs = CompileVm(ctx, module, node->rhs);

	VmValue *result = NULL;

	switch(node->op)
	{
	case SYN_BINARY_OP_ADD:
		result = CreateAdd(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_SUB:
		result = CreateSub(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_MUL:
		result = CreateMul(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_DIV:
		result = CreateDiv(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_MOD:
		result = CreateMod(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_POW:
		result = CreatePow(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_SHL:
		result = CreateShl(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_SHR:
		result = CreateShr(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_LESS:
		result = CreateCompareLess(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_LESS_EQUAL:
		result = CreateCompareLessEqual(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_GREATER:
		result = CreateCompareGreater(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_GREATER_EQUAL:
		result = CreateCompareGreaterEqual(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_EQUAL:
		result = CreateCompareEqual(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_NOT_EQUAL:
		result = CreateCompareNotEqual(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_BIT_AND:
		result = CreateAnd(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_BIT_OR:
		result = CreateOr(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_BIT_XOR:
		result = CreateXor(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_LOGICAL_XOR:
		result = CreateCompareNotEqual(module, node->source, CreateCompareNotEqual(module, node->source, lhs, CreateConstantZero(module->allocator, node->source, lhs->type)), CreateCompareNotEqual(module, node->source, rhs, CreateConstantZero(module->allocator, node->source, rhs->type)));
		break;
	default:
		break;
	}

	assert(result);

	return CheckType(ctx, node, result);
}